

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

LPCSTR __thiscall NpyArray::LoadNPY(NpyArray *this,FILE *fp)

{
  char *pcVar1;
  size_t sVar2;
  EVP_PKEY_CTX *ctx;
  
  Release(this);
  ctx = (EVP_PKEY_CTX *)&this->shape;
  pcVar1 = ParseHeaderNPY(fp,(shape_t *)ctx,&this->wordSize,&this->type,&this->fortranOrder);
  if (pcVar1 == (LPCSTR)0x0) {
    init(this,ctx);
    sVar2 = fread(this->data,1,this->wordSize * this->numValues,(FILE *)fp);
    pcVar1 = (LPCSTR)0x0;
    if (sVar2 != this->wordSize * this->numValues) {
      pcVar1 = "error: failed fread";
    }
  }
  return pcVar1;
}

Assistant:

LPCSTR NpyArray::LoadNPY(FILE* fp)
{
	Release();
	LPCSTR ret = ParseHeaderNPY(fp, shape, wordSize, type, fortranOrder);
	if (ret != NULL)
		return ret;
	init();
	const size_t nread = fread(Data(), 1, SizeBytes(), fp);
	if (nread != SizeBytes())
		return "error: failed fread";
	return NULL;
}